

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O0

void __thiscall validation_layer::basic_leakChecker::basic_leakChecker(basic_leakChecker *this)

{
  bool bVar1;
  ZEbasic_leakChecker *this_00;
  ZESbasic_leakChecker *this_01;
  ZETbasic_leakChecker *this_02;
  value_type local_40;
  ZETbasic_leakChecker *local_38;
  ZETbasic_leakChecker *zetChecker;
  ZESbasic_leakChecker *zesChecker;
  ZEbasic_leakChecker *local_18;
  ZEbasic_leakChecker *zeChecker;
  basic_leakChecker *this_local;
  
  this->enablebasic_leak = false;
  zeChecker = (ZEbasic_leakChecker *)this;
  bVar1 = getenv_tobool("ZEL_ENABLE_BASIC_LEAK_CHECKER");
  this->enablebasic_leak = bVar1;
  if ((this->enablebasic_leak & 1U) != 0) {
    this_00 = (ZEbasic_leakChecker *)operator_new(0x40);
    ZEbasic_leakChecker::ZEbasic_leakChecker(this_00);
    local_18 = this_00;
    this_01 = (ZESbasic_leakChecker *)operator_new(8);
    ZESbasic_leakChecker::ZESbasic_leakChecker(this_01);
    zetChecker = (ZETbasic_leakChecker *)this_01;
    this_02 = (ZETbasic_leakChecker *)operator_new(8);
    ZETbasic_leakChecker::ZETbasic_leakChecker(this_02);
    basic_leak_checker = local_18;
    DAT_00322ef0 = zetChecker;
    local_40 = (value_type)&basic_leak_checker;
    DAT_00322ef8 = this_02;
    local_38 = this_02;
    std::
    vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
    ::push_back((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                 *)(context + 0xd30),&local_40);
  }
  return;
}

Assistant:

basic_leakChecker::basic_leakChecker() {
        enablebasic_leak = getenv_tobool( "ZEL_ENABLE_BASIC_LEAK_CHECKER" );
        if(enablebasic_leak) {
            basic_leakChecker::ZEbasic_leakChecker *zeChecker = new basic_leakChecker::ZEbasic_leakChecker;
            basic_leakChecker::ZESbasic_leakChecker *zesChecker = new basic_leakChecker::ZESbasic_leakChecker;
            basic_leakChecker::ZETbasic_leakChecker *zetChecker = new basic_leakChecker::ZETbasic_leakChecker;
            basic_leak_checker.zeValidation = zeChecker;
            basic_leak_checker.zetValidation = zetChecker;
            basic_leak_checker.zesValidation = zesChecker;
            validation_layer::context.validationHandlers.push_back(&basic_leak_checker);
        }
    }